

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::request_append_entries_for_all(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  nuraft_global_mgr *this_00;
  ptr<raft_server> pStack_58;
  unique_lock<std::recursive_mutex> guard;
  ptr<raft_params> params;
  
  nuraft::context::get_params((context *)&params);
  if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      use_bg_thread_for_urgent_commit_ == true) {
    this_00 = nuraft_global_mgr::get_instance();
    if (this_00 == (nuraft_global_mgr *)0x0) {
      EventAwaiter::invoke(this->bg_append_ea_);
    }
    else {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar2 = (*peVar1->_vptr_logger[7])();
        if (5 < iVar2) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)&guard,"found global thread pool");
          (*peVar1->_vptr_logger[8])
                    (peVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"request_append_entries_for_all",0x49,&guard);
          std::__cxx11::string::~string((string *)&guard);
        }
      }
      std::__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<nuraft::raft_server,void>
                ((__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2> *)&pStack_58,
                 (__weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<nuraft::raft_server>);
      nuraft_global_mgr::request_append(this_00,&pStack_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pStack_58.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  else {
    std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
    request_append_entries(this);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void raft_server::request_append_entries_for_all() {
    ptr<raft_params> params = ctx_->get_params();
    if (params->use_bg_thread_for_urgent_commit_) {
        // Let background generate request (some delay may happen).
        nuraft_global_mgr* mgr = nuraft_global_mgr::get_instance();
        if (mgr) {
            // Global thread pool exists, request it.
            p_tr("found global thread pool");
            mgr->request_append( this->shared_from_this() );
        } else {
            bg_append_ea_->invoke();
        }
    } else {
        // Directly generate request in user thread.
        recur_lock(lock_);
        request_append_entries();
    }
}